

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int ConnectP33xx(P33X *pP33x,char *szCfgFilePath)

{
  int iVar1;
  int local_24;
  int res;
  int id;
  char *szCfgFilePath_local;
  P33X *pP33x_local;
  
  local_24 = 0;
  do {
    if (addrsP33x[local_24] == (void *)0x0) {
      iVar1 = ConnectP33x(pP33x,szCfgFilePath);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsP33x[local_24] = pP33x;
      return 0;
    }
    local_24 = local_24 + 1;
  } while (local_24 < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int ConnectP33xx(P33X* pP33x, char* szCfgFilePath)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsP33x[id] != NULL)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = ConnectP33x(pP33x, szCfgFilePath);
	if (res != EXIT_SUCCESS) return res;

	addrsP33x[id] = pP33x;

	return EXIT_SUCCESS;
}